

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slider.cpp
# Opt level: O1

bool __thiscall gui::Slider::handleMouseMove(Slider *this,Vector2f *mouseParent)

{
  float fVar1;
  Vector2f VVar2;
  bool bVar3;
  undefined1 uVar4;
  Transform *this_00;
  Vector2f *pVVar5;
  float local_28;
  
  bVar3 = Widget::handleMouseMove(&this->super_Widget,mouseParent);
  uVar4 = 1;
  if (!bVar3) {
    this_00 = Widget::getInverseTransform(&this->super_Widget);
    VVar2 = sf::Transform::transformPoint(this_00,mouseParent);
    pVVar5 = Widget::getOrigin(&this->super_Widget);
    if (this->isDragging_ == true) {
      local_28 = VVar2.x;
      fVar1 = pVVar5->x;
      bVar3 = sf::Mouse::isButtonPressed(Left);
      if (bVar3) {
        pVVar5 = Widget::getOrigin(&this->super_Widget);
        updateThumb(this,(local_28 - fVar1) + pVVar5->x);
      }
      else {
        this->isDragging_ = false;
        Widget::requestRedraw(&this->super_Widget);
      }
    }
    uVar4 = this->isDragging_;
  }
  return (bool)uVar4;
}

Assistant:

bool Slider::handleMouseMove(const sf::Vector2f& mouseParent) {
    if (baseClass::handleMouseMove(mouseParent)) {
        return true;
    }
    const auto mouseLocal = toLocalOriginSpace(mouseParent);

    if (isDragging_) {
        if (sf::Mouse::isButtonPressed(sf::Mouse::Left)) {
            updateThumb(mouseLocal.x + getOrigin().x);
        } else {
            isDragging_ = false;
            requestRedraw();
        }
    }

    return isDragging_;
}